

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall
AbstractTaskProvider::AbstractTaskProvider(AbstractTaskProvider *this,AbstractTaskProvider *param_2)

{
  atomic<unsigned_long> *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__AbstractTaskProvider_00217c78;
  std::atomic<unsigned_long>::atomic(in_RSI,(__integral_type)in_RDI);
  std::atomic<unsigned_long>::atomic(in_RSI,(__integral_type)in_RDI);
  std::atomic<unsigned_long>::atomic(in_RSI,(__integral_type)in_RDI);
  *(undefined1 *)(in_RDI + 4) = 0;
  std::mutex::mutex((mutex *)0x12fa55);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 10));
  *(undefined1 *)(in_RDI + 0x10) = 0;
  return;
}

Assistant:

AbstractTaskProvider::AbstractTaskProvider( const AbstractTaskProvider & )
    : _taskCount         ( 0 )
    , _givenTaskCount    ( 0 )
    , _completedTaskCount( 0 )
    , _running           ( false )
    , _exceptionRaised   ( false )
{
}